

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O2

ssize_t __thiscall QGifHandler::read(QGifHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  long *plVar4;
  long lVar5;
  uchar *buffer;
  undefined4 in_register_00000034;
  QGIFFormat *pQVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while (pQVar6 = this->gifFormat, pQVar6->newFrame == false) {
    lVar5 = (this->buffer).d.size;
    if (lVar5 == 0) {
      QImageIOHandler::device();
      QIODevice::read((longlong)&local_50);
      QByteArray::append(&this->buffer);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      pQVar6 = this->gifFormat;
      lVar5 = (this->buffer).d.size;
      if (lVar5 == 0) break;
    }
    buffer = (uchar *)(this->buffer).d.ptr;
    if (buffer == (uchar *)0x0) {
      buffer = (uchar *)&QByteArray::_empty;
    }
    iVar2 = QGIFFormat::decode(pQVar6,&this->lastImage,buffer,(int)lVar5,&this->nextDelay,
                               &this->loopCnt);
    if (iVar2 == -1) {
      pQVar6 = this->gifFormat;
      break;
    }
    QByteArray::remove((longlong)&this->buffer,0);
  }
  if (pQVar6->newFrame == false) {
    if (pQVar6->partialNewFrame == true) {
      plVar4 = (long *)QImageIOHandler::device();
      cVar1 = (**(code **)(*plVar4 + 0x90))(plVar4);
      if (cVar1 != '\0') goto LAB_00104a53;
    }
    sVar3 = 0;
  }
  else {
LAB_00104a53:
    QImage::operator=((QImage *)CONCAT44(in_register_00000034,__fd),&this->lastImage);
    this->frameNumber = this->frameNumber + 1;
    pQVar6 = this->gifFormat;
    pQVar6->newFrame = false;
    pQVar6->partialNewFrame = false;
    sVar3 = CONCAT71((int7)((ulong)pQVar6 >> 8),1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QGifHandler::read(QImage *image)
{
    const int GifChunkSize = 4096;

    while (!gifFormat->newFrame) {
        if (buffer.isEmpty()) {
            buffer += device()->read(GifChunkSize);
            if (buffer.isEmpty())
                break;
        }

        int decoded = gifFormat->decode(&lastImage, (const uchar *)buffer.constData(), buffer.size(),
                                        &nextDelay, &loopCnt);
        if (decoded == -1)
            break;
        buffer.remove(0, decoded);
    }
    if (gifFormat->newFrame || (gifFormat->partialNewFrame && device()->atEnd())) {
        *image = lastImage;
        ++frameNumber;
        gifFormat->newFrame = false;
        gifFormat->partialNewFrame = false;
        return true;
    }

    return false;
}